

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpResponse.cpp
# Opt level: O3

bool __thiscall higan::HttpResponse::SetFileToResponse(HttpResponse *this,string *file_path)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  pointer pcVar2;
  undefined1 auVar3 [8];
  _Alloc_hider _Var4;
  bool bVar5;
  FileStatus FVar6;
  undefined1 auStack_58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  undefined1 local_29;
  
  auStack_58 = (undefined1  [8])0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<higan::FileForRead,std::allocator<higan::FileForRead>,std::__cxx11::string_const&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&__str,(FileForRead **)auStack_58,
             (allocator<higan::FileForRead> *)&local_29,file_path);
  _Var4 = __str._M_dataplus;
  auVar3 = auStack_58;
  auStack_58 = (undefined1  [8])0x0;
  __str._M_dataplus._M_p = (pointer)0x0;
  p_Var1 = (this->file_ptr_).super___shared_ptr<higan::FileForRead,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->file_ptr_).super___shared_ptr<higan::FileForRead,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)auVar3;
  (this->file_ptr_).super___shared_ptr<higan::FileForRead,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var4._M_p;
  if ((p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
     (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1),
     __str._M_dataplus._M_p != (pointer)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__str._M_dataplus._M_p);
  }
  FVar6 = FileForRead::GetFileStatus
                    ((this->file_ptr_).
                     super___shared_ptr<higan::FileForRead,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  bVar5 = true;
  if (FVar6 != OPEN_SUCCESS) {
    if (FVar6 == IS_DIR) {
      pcVar2 = (file_path->_M_dataplus)._M_p;
      auStack_58 = (undefined1  [8])&__str._M_string_length;
      std::__cxx11::string::_M_construct<char*>
                ((string *)auStack_58,pcVar2,pcVar2 + file_path->_M_string_length);
      std::__cxx11::string::append((char *)auStack_58);
      bVar5 = SetFileToResponse(this,(string *)auStack_58);
      if (auStack_58 != (undefined1  [8])&__str._M_string_length) {
        operator_delete((void *)auStack_58,__str._M_string_length + 1);
      }
      if (bVar5) {
        return true;
      }
    }
    p_Var1 = (this->file_ptr_).super___shared_ptr<higan::FileForRead,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (this->file_ptr_).super___shared_ptr<higan::FileForRead,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this->file_ptr_).super___shared_ptr<higan::FileForRead,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    }
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool HttpResponse::SetFileToResponse(const std::string& file_path)
{
	file_ptr_ = std::make_shared<FileForRead>(file_path);

	bool add_ok_result = false;

	switch (file_ptr_->GetFileStatus())
	{
		case FileForRead::FileStatus::NOT_EXIST:
			add_ok_result = false;
			break;
		case FileForRead::FileStatus::IS_DIR:
			add_ok_result = SetFileToResponse(file_path + "/index.html");
			break;
		case FileForRead::FileStatus::OPEN_SUCCESS:
			add_ok_result = true;
			break;
		case FileForRead::FileStatus::OPEN_ERROR:
			add_ok_result = false;
			break;
	}

	if (!add_ok_result)
	{
		file_ptr_.reset();
	}
	return add_ok_result;
}